

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O2

void __thiscall
CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
CustomType(CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,CustomType<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  int iVar1;
  ostream *poVar2;
  
  std::__cxx11::string::string((string *)this,(string *)other);
  iVar1 = idCounter + 1;
  this->id = idCounter;
  idCounter = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"CustomType<");
  poVar2 = std::operator<<(poVar2,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
  poVar2 = std::operator<<(poVar2,">::CustomType() id");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->id);
  poVar2 = std::operator<<(poVar2," move ctor, t=");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

CustomType(CustomType&& other) noexcept : t(std::move(other.t)), id(idCounter++) {
        std::cout << "CustomType<" << typeid(T).name() << ">::CustomType() id" << id << " move ctor, t=" << this->t << "\n";
    }